

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O2

void __thiscall StatisticsApp::StatisticsApp(StatisticsApp *this,CommandLineOptions *options)

{
  ofstream *this_00;
  time_t tVar1;
  ostream *poVar2;
  ostream *extraout_RAX;
  uint __seed;
  ostream *poVar3;
  double __x;
  string asStack_1c8 [32];
  stringstream msg;
  ostream local_198 [376];
  
  CommandLineOptions::CommandLineOptions(&this->_options,options);
  this_00 = &this->_outputFile;
  std::ofstream::ofstream((ofstream *)this_00);
  this->_outputStream = (ostream *)0x0;
  MultivariateTracker::MultivariateTracker(&this->_tracker,0,&options->statisticsOptions);
  Logger::logLevel = (Type)(this->_options).verboseLevel;
  __seed = options->seed;
  if (__seed == 0) {
    tVar1 = time((time_t *)0x0);
    __seed = (uint)tVar1;
  }
  srand(__seed);
  std::ofstream::open((ofstream *)this_00,(this->_options).fileOutput._M_dataplus._M_p,_S_out);
  poVar3 = (ostream *)this_00;
  if (((*(int *)(&this->field_0x140 + *(long *)(*(long *)this_00 + -0x18)) != 0) &&
      (poVar3 = (ostream *)&std::cout, (this->_options).fileOutput._M_string_length != 0)) &&
     (0 < (int)Logger::logLevel)) {
    std::__cxx11::stringstream::stringstream((stringstream *)&msg);
    poVar2 = std::operator<<(local_198,"Output file failed to open. Writting to standard output.");
    std::endl<char,std::char_traits<char>>(poVar2);
    Logger::log(__x);
    std::__cxx11::stringbuf::str();
    std::operator<<(extraout_RAX,asStack_1c8);
    std::__cxx11::string::~string(asStack_1c8);
    std::__cxx11::stringstream::~stringstream((stringstream *)&msg);
    poVar3 = (ostream *)this_00;
    if (*(int *)(&this->field_0x140 + *(long *)(*(long *)this_00 + -0x18)) != 0) {
      poVar3 = (ostream *)&std::cout;
    }
  }
  this->_outputStream = poVar3;
  return;
}

Assistant:

StatisticsApp(CommandLineOptions const & options) :
        _options(options),
        _outputStream(0),
        _tracker(MultivariateTracker(0, options.statisticsOptions))
    {
        Logger::logLevel = (Logger::Level::Type)this->_options.verboseLevel;

        // ==================================================
        // Seed random number generator
        // --------------------------------------------------
        srand((options.seed == 0 ? (unsigned int)time(0) : options.seed));

        // ==================================================
        // Define output stream
        // --------------------------------------------------
        this->_outputFile.open(this->_options.fileOutput.c_str(), std::ios::out);
        if (!this->_outputFile.good() && !this->_options.fileOutput.empty())
        {
            LOG_MESSAGE(Logger::Level::ERROR, "Output file failed to open. Writting to standard output.");
        }
        this->_outputStream = (this->_outputFile.good() ? &this->_outputFile : &std::cout);
    }